

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

bool __thiscall Memory::HeapInfo::AllocatorsAreEmpty(HeapInfo *this)

{
  bool bVar1;
  HeapBucketGroup<MediumAllocationBlockAttributes> *this_00;
  long lVar2;
  ulong uVar3;
  
  lVar2 = 0x78;
  do {
    bVar1 = HeapBucketGroup<SmallAllocationBlockAttributes>::AllocatorsAreEmpty
                      ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
                       ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->
                               recycler + lVar2));
    if (!bVar1) {
      return false;
    }
    lVar2 = lVar2 + 0x380;
  } while (lVar2 != 0xa878);
  this_00 = this->mediumHeapBuckets;
  uVar3 = 0xffffffffffffffff;
  do {
    bVar1 = HeapBucketGroup<MediumAllocationBlockAttributes>::AllocatorsAreEmpty(this_00);
    if (!bVar1) {
      return false;
    }
    uVar3 = uVar3 + 1;
    this_00 = this_00 + 1;
  } while (uVar3 != 0x1c);
  return 0x1b < uVar3;
}

Assistant:

bool
HeapInfo::AllocatorsAreEmpty()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        if (!heapBuckets[i].AllocatorsAreEmpty())
        {
            return false;
        }
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        if (!mediumHeapBuckets[i].AllocatorsAreEmpty())
        {
            return false;
        }
    }

#endif

    return true;
}